

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O2

string * __thiscall
duckdb::StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
          (string *__return_storage_ptr__,StringUtil *this,string *fmt_str,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  ::std::__cxx11::string::string((string *)&local_38,(string *)fmt_str);
  ::std::__cxx11::string::string((string *)&bStack_58,(string *)params);
  Exception::ConstructMessage<std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(Exception *)this,&local_38,&bStack_58,params_1);
  ::std::__cxx11::string::~string((string *)&bStack_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

static string Format(const string fmt_str, ARGS... params) {
		return Exception::ConstructMessage(fmt_str, params...);
	}